

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

size_t Catch::listTests(Config *config)

{
  _func_int **pp_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar5;
  undefined4 extraout_var_00;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases;
  ostream *poVar6;
  pointer this;
  long lVar7;
  ulong uVar8;
  undefined4 uVar11;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> matchedTestCases;
  TestSpec testSpec;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_98;
  string local_80;
  TestSpec local_60;
  
  iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_60.m_filters,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar2));
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60.m_invalidArgs,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               CONCAT44(extraout_var,iVar2) + 1));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"name\tgroup",10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
  std::ostream::put('@');
  std::ostream::flush();
  pSVar5 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
           ::getInternal();
  iVar2 = (*(pSVar5->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar5);
  testCases = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x18))
                        ((long *)CONCAT44(extraout_var_00,iVar2),config);
  filterTests(&local_98,testCases,&local_60,&config->super_IConfig);
  lVar7 = (long)local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_start;
  iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x13])(config);
  uVar8 = (lVar7 >> 3) * -0x2c8590b21642c859;
  pp_Var1 = (config->super_IConfig).super_NonCopyable._vptr_NonCopyable;
  uVar11 = (undefined4)(uVar8 >> 0x20);
  if (iVar2 < 0) {
    iVar2 = (*pp_Var1[0x14])(config);
    if (iVar2 < 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x14])(config);
      auVar9._8_4_ = uVar11;
      auVar9._0_8_ = uVar8;
      auVar9._12_4_ = 0x45300000;
      iVar2 = (int)(((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) *
                   ((double)iVar2 / 100.0));
    }
  }
  else {
    iVar2 = (*pp_Var1[0x13])(config);
  }
  iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x15])(config);
  pp_Var1 = (config->super_IConfig).super_NonCopyable._vptr_NonCopyable;
  if (iVar3 < 0) {
    iVar3 = (*pp_Var1[0x16])(config);
    if (-1 < iVar3) {
      iVar3 = (*(config->super_IConfig).super_NonCopyable._vptr_NonCopyable[0x16])(config);
      auVar10._8_4_ = uVar11;
      auVar10._0_8_ = uVar8;
      auVar10._12_4_ = 0x45300000;
      uVar8 = (ulong)(uint)(int)(((auVar10._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) *
                                ((double)iVar3 / 100.0));
    }
  }
  else {
    uVar4 = (*pp_Var1[0x15])(config);
    uVar8 = (ulong)uVar4;
  }
  if (local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    iVar3 = 0;
    this = local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
           super__Vector_impl_data._M_start;
    do {
      if ((iVar2 <= iVar3) && (iVar3 < (int)uVar8)) {
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(this->super_TestCaseInfo).name._M_dataplus._M_p,
                            (this->super_TestCaseInfo).name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\t",1);
        if ((this->super_TestCaseInfo).tags.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->super_TestCaseInfo).tags.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          TestCaseInfo::tagsAsString_abi_cxx11_(&local_80,&this->super_TestCaseInfo);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,local_80._M_dataplus._M_p,local_80._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p);
          }
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
        std::ostream::put('@');
        std::ostream::flush();
      }
      this = this + 1;
      iVar3 = iVar3 + 1;
    } while (this != local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  }
  clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_98);
  clara::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.m_invalidArgs);
  clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_60.m_filters);
  return ((long)local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3) * -0x2c8590b21642c859;
}

Assistant:

std::size_t listTests( Config const& config ) {
        TestSpec testSpec = config.testSpec();
        Catch::cout() << "name\tgroup" << std::endl;

        auto matchedTestCases = filterTests( getAllTestCasesSorted( config ), testSpec, config );
        auto total_tests_run = matchedTestCases.size();
        int start_offset = 0;
        int end_offset = total_tests_run;
        if (config.startOffset() >= 0) {
            start_offset = config.startOffset();
        } else if (config.startOffsetPercentage() >= 0) {
            start_offset = int((config.startOffsetPercentage() / 100.0) * total_tests_run);
        }
        if (config.endOffset() >= 0) {
            end_offset = config.endOffset();
        } else if (config.endOffsetPercentage() >= 0) {
            end_offset = int((config.endOffsetPercentage() / 100.0) * total_tests_run);
        }
        auto it = matchedTestCases.begin();
        for(int current_test = 0; it != matchedTestCases.end(); current_test++) {
            if (current_test < start_offset || current_test >= end_offset) {
                // skip this test
                it++;
                continue;
            }
            auto &testCaseInfo = *it;
            Catch::cout() << testCaseInfo.name << "\t";
            if( !testCaseInfo.tags.empty() ) {
                Catch::cout() << testCaseInfo.tagsAsString();
            }
            Catch::cout() << std::endl;
            it++;
        }
        return matchedTestCases.size();
    }